

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagegenerator.cpp
# Opt level: O1

void stackjit::anon_unknown_3::addData<unsigned_long>(BinaryData *data,unsigned_long value)

{
  pointer *ppcVar1;
  iterator __position;
  char *valuePtr;
  size_t i;
  long lVar2;
  unsigned_long local_18;
  
  local_18 = value;
  lVar2 = 0;
  do {
    __position._M_current =
         (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                ((vector<char,std::allocator<char>> *)data,__position,
                 (char *)((long)&local_18 + lVar2));
    }
    else {
      *__position._M_current = *(char *)((long)&local_18 + lVar2);
      ppcVar1 = &(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return;
}

Assistant:

void addData(BinaryData& data, T value) {
			auto valuePtr = reinterpret_cast<char*>(&value);

			for (std::size_t i = 0; i < sizeof(T); i++) {
				data.push_back(valuePtr[i]);
			}
		}